

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_rootindexproxymodel.cpp
# Opt level: O3

int __thiscall RootIndexProxyModel::qt_metacall(RootIndexProxyModel *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined4 in_register_00000014;
  RootIndexProxyModel *_t;
  
  _id_00 = QIdentityProxyModel::qt_metacall
                     ((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if ((-1 < _id_00) && (_c < (BindableProperty|ReadProperty))) {
    if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
      if (_c == InvokeMetaMethod) {
        if (_id_00 == 0) {
          QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
        }
      }
      else {
        if (_c != RegisterMethodArgumentMetaType) {
          return _id_00;
        }
        if (_id_00 == 0) {
          *(undefined8 *)*_a = 0;
        }
      }
    }
    else {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
    }
    _id_00 = _id_00 + -1;
  }
  return _id_00;
}

Assistant:

int RootIndexProxyModel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QIdentityProxyModel::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}